

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O3

void __thiscall depspawn::internal::TaskPool::main(TaskPool *this)

{
  bool bVar1;
  
  if (this->finish_ == false) {
    do {
      do {
        bVar1 = try_run(this);
      } while (bVar1);
      LOCK();
      (this->busy_threads_).super___atomic_base<int>._M_i =
           (this->busy_threads_).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (this->finish_ == false) {
        do {
          if (((this->hp_queue_).head_._M_i.index != (this->hp_queue_).tail_._M_i.index) ||
             ((this->queue_).head_._M_i.index != (this->queue_).tail_._M_i.index)) break;
          if ((this->idle_func_).super__Function_base._M_manager != (_Manager_type)0x0) {
            (*(this->idle_func_)._M_invoker)((_Any_data *)&this->idle_func_);
          }
        } while (this->finish_ != true);
      }
      LOCK();
      (this->busy_threads_).super___atomic_base<int>._M_i =
           (this->busy_threads_).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    } while (this->finish_ != true);
  }
  LOCK();
  (this->busy_threads_).super___atomic_base<int>._M_i =
       (this->busy_threads_).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  return;
}

Assistant:

void main()
  {
    while (!finish_) {
      empty_queue();
      busy_threads_.fetch_sub(1);
      while(!finish_ && empty()) {
        if (idle_func_) {
          idle_func_();
        }
      }
      busy_threads_.fetch_add(1);
    }

    busy_threads_.fetch_sub(1);
  }